

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::get_allocs_
          (compact_bonsai_nlm<int,_16UL> *this,uint64_t chunk_id,uint64_t pos_in_chunk)

{
  reference pvVar1;
  uint64_t uVar2;
  long lVar3;
  size_type in_RSI;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t len;
  uint64_t i;
  uint64_t back_alloc;
  uint64_t front_alloc;
  uint64_t offset;
  uint64_t num;
  uint8_t *ptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffa0;
  uint16_t x;
  uint64_t uVar4;
  ulong local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  uint64_t local_40;
  ulong local_38;
  pointer local_30;
  size_type local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = in_RSI;
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::operator[](in_RDI,in_RSI);
  local_30 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_ffffffffffffffa0);
  x = (uint16_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30);
  pvVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),
                      local_20);
  uVar2 = bit_tools::popcnt(*pvVar1);
  local_38 = uVar2 - 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),local_20);
  local_40 = bit_tools::popcnt(x,(uint64_t)in_RDI);
  local_48 = 0;
  local_50 = 0;
  for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
    uVar4 = 0;
    uVar2 = vbyte::decode(local_30,(uint64_t *)&stack0xffffffffffffffa0);
    lVar3 = uVar2 + uVar4;
    if (local_58 < local_40) {
      local_48 = lVar3 + local_48;
    }
    else {
      local_50 = lVar3 + local_50;
    }
    local_30 = local_30 + lVar3;
  }
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            (&local_10,&local_48,&local_50);
  return local_10;
}

Assistant:

std::pair<uint64_t, uint64_t> get_allocs_(uint64_t chunk_id, uint64_t pos_in_chunk) {
        assert(bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));

        const uint8_t* ptr = ptrs_[chunk_id].get();
        assert(ptr != nullptr);

        // -1 means the difference of the above bit_tools::set_bit
        const uint64_t num = bit_tools::popcnt(chunks_[chunk_id]) - 1;
        const uint64_t offset = bit_tools::popcnt(chunks_[chunk_id], pos_in_chunk);

        uint64_t front_alloc = 0, back_alloc = 0;

        for (uint64_t i = 0; i < num; ++i) {
            uint64_t len = 0;
            len += vbyte::decode(ptr, len);
            if (i < offset) {
                front_alloc += len;
            } else {
                back_alloc += len;
            }
            ptr += len;
        }

        return {front_alloc, back_alloc};
    }